

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O2

time_t cm_get_date(time_t now,char *p)

{
  byte bVar1;
  int iVar2;
  ushort *puVar3;
  char *__s;
  int Count;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  ushort **ppuVar7;
  __int32_t **pp_Var8;
  size_t sVar9;
  size_t __n;
  ulong uVar10;
  time_t tVar11;
  time_t Future;
  time_t tVar12;
  int iVar13;
  ulong uVar14;
  ushort uVar15;
  token *ptVar16;
  token *ptVar17;
  ulong *puVar18;
  uint uVar19;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  time_t *ptVar27;
  int iVar28;
  byte *pbVar29;
  char cVar30;
  long lStack_1130;
  int local_111c;
  byte *local_1118;
  int local_110c;
  ulong local_1100;
  ulong local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  time_t local_10e0;
  int local_10d4;
  ulong local_10d0;
  int local_10c4;
  int local_10c0;
  int local_10bc;
  int local_10b8;
  int local_10b4;
  ulong local_10b0;
  time_t now_local;
  time_t local_10a0;
  time_t local_1098;
  token *local_1090;
  long local_1088;
  tm *local_1080;
  time_t local_1078 [8];
  token tokens [256];
  ulong uVar20;
  
  now_local = now;
  memset(tokens,0,0x1000);
  local_10f8 = 0;
  local_1100 = 0;
  local_10e8 = 0;
  ptVar6 = localtime(&now_local);
  if (ptVar6 == (tm *)0x0) {
    return -1;
  }
  local_10d4 = ptVar6->tm_sec;
  iVar5 = ptVar6->tm_min;
  iVar22 = ptVar6->tm_hour;
  local_10b4 = ptVar6->tm_mday;
  local_10b8 = ptVar6->tm_mon;
  iVar26 = ptVar6->tm_year;
  iVar28 = ptVar6->tm_yday;
  iVar13 = ptVar6->tm_isdst;
  local_1080 = gmtime(&now_local);
  if (local_1080 == (tm *)0x0) {
    lVar24 = 0;
  }
  else {
    iVar2 = local_1080->tm_year + 0x76b;
    iVar23 = iVar2 / 100;
    iVar4 = (iVar26 + 0x76b) / 100;
    lVar24 = ((long)local_1080->tm_sec - (long)local_10d4) +
             ((long)local_1080->tm_min - (long)iVar5) * 0x3c +
             ((long)local_1080->tm_hour - (long)iVar22) * 0xe10 +
             (long)(((iVar4 + local_1080->tm_yday) -
                    (iVar28 + (iVar26 + 0x76b >> 2) + iVar23 + (iVar4 >> 2))) +
                   (local_1080->tm_year - iVar26) * 0x16d + (iVar2 >> 2) + (iVar23 >> 2)) * 0x15180;
  }
  local_1088 = lVar24 + 0xe10;
  if (iVar13 == 0) {
    local_1088 = lVar24;
  }
  local_10c4 = iVar22;
  local_10c0 = iVar5;
  local_10bc = iVar26;
  ppuVar7 = __ctype_b_loc();
  puVar3 = *ppuVar7;
  uVar14 = 0;
  do {
    local_1090 = (token *)((long)&tokens[0].token + uVar14);
    pbVar29 = (byte *)p;
    while( true ) {
      do {
        p = (char *)pbVar29;
        uVar10 = (ulong)(byte)*p;
        uVar15 = puVar3[uVar10];
        pbVar29 = (byte *)p + 1;
      } while ((uVar15 >> 0xd & 1) != 0);
      if (*p != 0x28) break;
      iVar5 = 0;
      do {
        bVar1 = *p;
        if (bVar1 == 0x28) {
          iVar5 = iVar5 + 1;
        }
        else if (bVar1 == 0x29) {
          iVar5 = iVar5 + -1;
        }
        else if (bVar1 == 0) {
          local_1090->token = 0;
          goto LAB_00443dad;
        }
        p = (char *)((byte *)p + 1);
        pbVar29 = (byte *)p;
      } while (0 < iVar5);
    }
    uVar20 = 0;
    local_1118 = (byte *)p;
    local_10f0 = uVar14;
    while( true ) {
      uVar19 = (uint)uVar20;
      cVar30 = (char)uVar10;
      if (cVar30 == '\0') break;
      uVar14 = uVar20;
      if ((puVar3[uVar10] & 8) == 0) {
        if ((cVar30 != '.') || (0x3e < uVar19)) break;
      }
      else {
        if (0x3e < uVar19) break;
        if (cVar30 != '.') {
          if ((puVar3[uVar10] >> 8 & 1) != 0) {
            pp_Var8 = __ctype_tolower_loc();
            cVar30 = (char)(*pp_Var8)[uVar10];
          }
          uVar14 = (ulong)(uVar19 + 1);
          *(char *)((long)local_1078 + uVar20) = cVar30;
        }
      }
      uVar10 = (ulong)local_1118[1];
      local_1118 = local_1118 + 1;
      uVar20 = uVar14;
    }
    *(undefined1 *)((long)local_1078 + uVar20) = 0;
    for (ptVar27 = &TimeWords[0].value; __s = (char *)ptVar27[-2], __s != (char *)0x0;
        ptVar27 = ptVar27 + 4) {
      sVar9 = ((LEXICON *)(ptVar27 + -3))->abbrev;
      if (sVar9 == 0) {
        sVar9 = strlen(__s);
      }
      __n = strlen((char *)local_1078);
      if ((sVar9 <= __n) && (iVar5 = strncmp(__s,(char *)local_1078,__n), iVar5 == 0)) {
        local_1090->value = *ptVar27;
        iVar5 = *(int *)(ptVar27 + -1);
        pbVar29 = local_1118;
        goto LAB_00443d89;
      }
    }
    if ((uVar15 >> 0xb & 1) == 0) {
      iVar5 = (int)*p;
LAB_00443d89:
      local_1090->token = iVar5;
      p = (char *)pbVar29;
      if (iVar5 == 0) {
LAB_00443dad:
        lVar24 = 0x30;
        local_111c = 0;
        iVar26 = 0;
        local_10f0._0_4_ = 0;
        local_110c = 0;
        iVar28 = 0;
        iVar22 = 0;
        local_1118 = (byte *)0x0;
        local_10b0 = 0;
        local_10d0 = 0;
        local_10e0 = 0;
        cVar30 = false;
        local_1098 = 0;
        local_10a0 = 0;
        lVar25 = 0;
        lVar21 = 0;
        ptVar17 = tokens;
        iVar5 = 0;
        tVar11 = local_1098;
        break;
      }
    }
    else {
      lVar24 = 0;
      while( true ) {
        local_1090->value = lVar24;
        bVar1 = *p;
        if ((*(byte *)((long)puVar3 + (ulong)bVar1 * 2 + 1) & 8) == 0) break;
        p = (char *)((byte *)p + 1);
        lVar24 = lVar24 * 10 + (long)(char)bVar1 + -0x30;
      }
      local_1090->token = 0x10b;
    }
    uVar14 = local_10f0 + 0x10;
    if (0xfe0 < local_10f0) {
      return -1;
    }
  } while( true );
LAB_00443e34:
  local_1098 = tVar11;
  iVar13 = iVar5;
  ptVar16 = ptVar17;
  if (local_1090 <= ptVar16) {
    if (iVar28 == 0) {
      cVar30 = '\x02';
      local_1118 = (byte *)local_1088;
    }
    else if (local_1080 != (tm *)0x0) {
      now_local = now_local - (long)local_1118;
      ptVar6 = gmtime(&now_local);
      if (ptVar6 != (tm *)0x0) {
        local_10d4 = ptVar6->tm_sec;
        local_10c0 = ptVar6->tm_min;
        local_10c4 = ptVar6->tm_hour;
        local_10b4 = ptVar6->tm_mday;
        local_10b8 = ptVar6->tm_mon;
        local_10bc = ptVar6->tm_year;
      }
      now_local = now_local + (long)local_1118;
    }
    iVar5 = (int)local_10f0;
    if (local_111c == 0) {
      local_10e8 = (ulong)(local_10bc + 0x76c);
    }
    if (iVar26 == 0) {
      local_1100 = (ulong)(local_10b8 + 1);
    }
    if ((int)local_10f0 == 0) {
      local_10f8 = (ulong)local_10b4;
    }
    if (((int)local_10f0 < 2 && iVar26 < 2) &&
        ((local_111c < 2 && iVar13 < 2) && (iVar28 < 2 && local_110c < 2))) {
      local_10f0 = CONCAT44(local_10f0._4_4_,iVar13);
      if ((((iVar26 == 0 && local_111c == 0) && iVar5 == 0) && iVar13 == 0) && local_110c == 0) {
        tVar11 = now_local;
        if (iVar22 == 0) {
          tVar11 = now_local +
                   (long)local_10c4 * -0xe10 + ((long)local_10c0 * -0x3c - (long)local_10d4);
        }
      }
      else {
        tVar11 = Convert(local_1100,local_10f8,local_10e8,local_10b0,local_10d0,local_10e0);
        if (tVar11 < 0) {
          return -1;
        }
      }
      if (lVar25 == 0) {
        tVar12 = 0;
      }
      else {
        local_1078[0] = tVar11 + lVar21;
        ptVar6 = localtime(local_1078);
        tVar12 = local_1078[0];
        lVar24 = lVar25 + ptVar6->tm_mon + (long)(ptVar6->tm_year * 0xc + 0x5910);
        Future = Convert(lVar24 % 0xc + 1,(long)ptVar6->tm_mday,lVar24 / 0xc,(long)ptVar6->tm_hour,
                         (long)ptVar6->tm_min,(long)ptVar6->tm_sec);
        tVar12 = DSTcorrect(tVar12,Future);
      }
      lVar24 = tVar12 + tVar11 + lVar21;
      if (((int)local_10f0 != 0) && ((iVar26 == 0 && local_111c == 0) && iVar5 == 0)) {
        local_1078[0] = lVar24 - (long)local_1118;
        ptVar6 = gmtime(local_1078);
        lVar21 = (local_1098 - (ulong)(0 < local_1098)) * 0x93a80 + lVar24 +
                 (((local_10a0 - ptVar6->tm_wday) + 7) % 7) * 0x15180;
        if (cVar30 == '\x02') {
          lVar21 = DSTcorrect(lVar24,lVar21);
        }
        else {
          lVar21 = lVar21 - lVar24;
        }
        lVar24 = lVar24 + lVar21;
      }
      tVar11 = 0;
      if (lVar24 != -1) {
        tVar11 = lVar24;
      }
    }
    else {
switchD_00443e54_caseD_107:
      tVar11 = -1;
    }
    return tVar11;
  }
  iVar2 = ptVar16->token;
  lStack_1130 = lVar24;
  iVar5 = iVar13;
  tVar11 = local_1098;
  switch(iVar2) {
  case 0x105:
    local_10a0 = ptVar16->value;
    local_1098 = 1;
    ptVar17 = ptVar16 + 1;
    iVar5 = iVar13 + 1;
    tVar11 = 1;
    if (ptVar16[1].token == 0x2c) {
LAB_00443e7a:
      ptVar17 = ptVar16 + 2;
      iVar5 = iVar13 + 1;
      tVar11 = local_1098;
    }
    goto LAB_00443e34;
  case 0x106:
    iVar28 = iVar28 + 1;
    local_1118 = (byte *)ptVar16->value;
    cVar30 = false;
    ptVar17 = ptVar16 + 1;
    goto LAB_00443e34;
  case 0x107:
    goto switchD_00443e54_caseD_107;
  case 0x108:
    if (ptVar16[1].token != 0x10b) goto switchD_00443e54_caseD_107;
    if ((ptVar16[2].token == 0x2c) && (ptVar16[3].token == 0x10b)) {
      local_111c = local_111c + 1;
      local_1100 = ptVar16->value;
      local_10f8 = ptVar16[1].value;
      uVar14 = ptVar16[3].value;
      puVar18 = &local_10e8;
      lStack_1130 = 0x40;
    }
    else {
      local_1100 = ptVar16->value;
      uVar14 = ptVar16[1].value;
      puVar18 = &local_10f8;
LAB_00443ff3:
      lStack_1130 = 0x20;
    }
LAB_00443ff7:
    local_10f0._0_4_ = (int)local_10f0 + 1;
    iVar26 = iVar26 + 1;
    *puVar18 = uVar14;
    ptVar17 = (token *)((long)&ptVar16->token + lStack_1130);
    goto LAB_00443e34;
  case 0x109:
    lVar25 = lVar25 + ptVar16->value;
    lStack_1130 = 0x10;
    break;
  case 0x10a:
    lVar21 = lVar21 + ptVar16->value;
    lStack_1130 = 0x10;
    break;
  case 0x10b:
    ptVar17 = ptVar16 + 1;
    iVar2 = ptVar16[1].token;
    switch(iVar2) {
    case 0x105:
      local_1098 = ptVar16->value;
      local_10a0 = ptVar16[1].value;
      goto LAB_00443e7a;
    case 0x107:
      goto switchD_00443ef2_caseD_107;
    case 0x108:
      if (ptVar16[2].token != 0x10b) {
        local_10f8 = ptVar16->value;
        uVar14 = ptVar16[1].value;
        puVar18 = &local_1100;
        goto LAB_00443ff3;
      }
      local_111c = local_111c + 1;
      local_10f8 = ptVar16->value;
      local_1100 = ptVar16[1].value;
      uVar14 = ptVar16[2].value;
      puVar18 = &local_10e8;
      goto LAB_00443ff7;
    case 0x109:
      lVar25 = lVar25 + ptVar16[1].value * ptVar16->value;
      goto LAB_004441b0;
    case 0x10a:
      lVar21 = lVar21 + ptVar16[1].value * ptVar16->value;
LAB_004441b0:
      lStack_1130 = 0x20;
      break;
    default:
      if (iVar2 == 0x2d) {
        if (ptVar16[2].token == 0x108) {
          if ((ptVar16[3].token == 0x2d) && (ptVar16[4].token == 0x10b)) {
            uVar10 = ptVar16->value;
            local_1100 = ptVar16[2].value;
            uVar14 = uVar10;
            local_10e8 = ptVar16[4].value;
            if (0x1f < (long)uVar10) {
              uVar14 = ptVar16[4].value;
              local_10e8 = uVar10;
            }
            goto LAB_004442e8;
          }
        }
        else if (((ptVar16[2].token == 0x10b) && (ptVar16[3].token == 0x2d)) &&
                (ptVar16[4].token == 0x10b)) {
          uVar14 = ptVar16->value;
LAB_0044426a:
          local_10e8 = uVar14;
          local_1100 = ptVar16[2].value;
          uVar14 = ptVar16[4].value;
LAB_004442e8:
          puVar18 = &local_10f8;
          goto LAB_0044441f;
        }
      }
      else if (iVar2 == 0x2f) {
        if (ptVar16[2].token == 0x10b) {
          if ((ptVar16[3].token != 0x2f) || (ptVar16[4].token != 0x10b)) {
            local_1100 = ptVar16->value;
            uVar14 = ptVar16[2].value;
            puVar18 = &local_10f8;
            goto LAB_00443ff7;
          }
          local_1100 = ptVar16->value;
          uVar14 = local_1100;
          if (0xc < (long)local_1100) goto LAB_0044426a;
          local_10f8 = ptVar16[2].value;
          uVar14 = ptVar16[4].value;
          puVar18 = &local_10e8;
LAB_0044441f:
          local_111c = local_111c + 1;
          lStack_1130 = 0x50;
          goto LAB_00443ff7;
        }
      }
      else if ((iVar2 == 0x3a) && (ptVar16[2].token == 0x10b)) {
        ptVar17 = ptVar16 + 3;
        iVar13 = ptVar16[3].token;
        if (iVar13 == 0x3a) {
          if (ptVar16[4].token == 0x10b) {
            local_10e0 = ptVar16[4].value;
            ptVar17 = ptVar16 + 5;
            iVar13 = ptVar16[5].token;
          }
          else {
            local_10e0 = 0;
            iVar13 = 0x3a;
          }
        }
        else {
          local_10e0 = 0;
        }
        local_10b0 = ptVar16->value;
        local_10d0 = ptVar16[2].value;
        if (iVar13 == 0x107) goto LAB_004440de;
        goto LAB_00444106;
      }
    case 0x106:
      uVar14 = ptVar16->value;
      if ((local_111c == 0 && iVar22 == 0) && local_110c != 0) {
        local_111c = 1;
        iVar22 = 0;
        local_10e8 = uVar14;
      }
      else if ((long)uVar14 < 0x2711) {
        if ((long)uVar14 < 0x18) {
          local_110c = local_110c + 1;
          local_10d0 = 0;
          local_10b0 = uVar14;
        }
        else {
          uVar15 = (ushort)uVar14 % 100;
          if ((0x95f < uVar14) || (0x3b < uVar15)) goto switchD_00443e54_caseD_107;
          local_10b0 = (ulong)(ushort)((ushort)uVar14 / 100);
          local_10d0 = (ulong)uVar15;
        }
        local_10e0 = 0;
      }
      else {
        local_10f8 = uVar14 % 100;
        local_111c = local_111c + 1;
        iVar26 = iVar26 + 1;
        local_10f0._0_4_ = (int)local_10f0 + 1;
        local_1100 = (uVar14 / 100) % 100;
        local_10e8 = uVar14 / 10000;
      }
      goto LAB_00443e34;
    }
  case 0x10c:
    goto switchD_00443e54_caseD_10c;
  default:
    if (iVar2 == 0x2b) {
      if (ptVar16[1].token != 0x10b) goto switchD_00443e54_caseD_107;
      if (ptVar16[2].token == 0x109) {
        lVar25 = lVar25 + ptVar16[2].value * ptVar16[1].value;
      }
      else {
        if (ptVar16[2].token != 0x10a) goto switchD_00443e54_caseD_107;
        lVar21 = lVar21 + ptVar16[2].value * ptVar16[1].value;
      }
    }
    else {
      if ((iVar2 != 0x2d) || (ptVar16[1].token != 0x10b)) goto switchD_00443e54_caseD_107;
      if (ptVar16[2].token == 0x109) {
        lVar25 = lVar25 - ptVar16[2].value * ptVar16[1].value;
      }
      else {
        if (ptVar16[2].token != 0x10a) goto switchD_00443e54_caseD_107;
        lVar21 = lVar21 - ptVar16[2].value * ptVar16[1].value;
      }
    }
  }
  iVar22 = iVar22 + 1;
  ptVar17 = (token *)((long)&ptVar16->token + lStack_1130);
  if (*(int *)((long)&ptVar16->token + lStack_1130) == 0x104) {
    lVar21 = -lVar21;
    lVar25 = -lVar25;
    ptVar17 = ptVar17 + 1;
  }
  goto LAB_00443e34;
switchD_00443e54_caseD_10c:
  cVar30 = ptVar16[1].token != 0x10d;
  iVar28 = iVar28 + 1;
  local_1118 = (byte *)ptVar16->value;
  ptVar17 = ptVar16 + 1;
  goto LAB_00443e34;
switchD_00443ef2_caseD_107:
  local_10b0 = ptVar16->value;
  local_10d0 = 0;
  local_10e0 = 0;
LAB_004440de:
  uVar10 = local_10b0 + 0xc;
  uVar14 = local_10b0;
  if (local_10b0 == 0xc) {
    uVar10 = local_10b0;
    uVar14 = 0;
  }
  local_10b0 = uVar10;
  if (ptVar17->value != 1) {
    local_10b0 = uVar14;
  }
  iVar13 = ptVar17[1].token;
  ptVar17 = ptVar17 + 1;
LAB_00444106:
  local_110c = local_110c + 1;
  if (iVar13 == 0x2b) {
    if (ptVar17[1].token != 0x10b) goto LAB_00443e34;
    iVar28 = iVar28 + 1;
    local_1118 = (byte *)((ptVar17[1].value % 100) * -0x3c + (ptVar17[1].value / 100) * -0xe10);
    iVar13 = ptVar17[2].token;
    ptVar17 = ptVar17 + 2;
    cVar30 = true;
  }
  if ((iVar13 == 0x2d) && (ptVar17[1].token == 0x10b)) {
    iVar28 = iVar28 + 1;
    local_1118 = (byte *)((ptVar17[1].value % 100) * 0x3c + (ptVar17[1].value / 100) * 0xe10);
    cVar30 = true;
    ptVar17 = ptVar17 + 2;
  }
  goto LAB_00443e34;
}

Assistant:

time_t
__archive_get_date(time_t now, const char *p)
{
	struct token	tokens[256];
	struct gdstate	_gds;
	struct token	*lasttoken;
	struct gdstate	*gds;
	struct tm	local, *tm;
	struct tm	gmt, *gmt_ptr;
	time_t		Start;
	time_t		tod;
	long		tzone;

	/* Clear out the parsed token array. */
	memset(tokens, 0, sizeof(tokens));
	/* Initialize the parser state. */
	memset(&_gds, 0, sizeof(_gds));
	gds = &_gds;

	/* Look up the current time. */
	memset(&local, 0, sizeof(local));
	tm = localtime (&now);
	if (tm == NULL)
		return -1;
	local = *tm;

	/* Look up UTC if we can and use that to determine the current
	 * timezone offset. */
	memset(&gmt, 0, sizeof(gmt));
	gmt_ptr = gmtime (&now);
	if (gmt_ptr != NULL) {
		/* Copy, in case localtime and gmtime use the same buffer. */
		gmt = *gmt_ptr;
	}
	if (gmt_ptr != NULL)
		tzone = difftm (&gmt, &local);
	else
		/* This system doesn't understand timezones; fake it. */
		tzone = 0;
	if(local.tm_isdst)
		tzone += HOUR;

	/* Tokenize the input string. */
	lasttoken = tokens;
	while ((lasttoken->token = nexttoken(&p, &lasttoken->value)) != 0) {
		++lasttoken;
		if (lasttoken > tokens + 255)
			return -1;
	}
	gds->tokenp = tokens;

	/* Match phrases until we run out of input tokens. */
	while (gds->tokenp < lasttoken) {
		if (!phrase(gds))
			return -1;
	}

	/* Use current local timezone if none was specified. */
	if (!gds->HaveZone) {
		gds->Timezone = tzone;
		gds->DSTmode = DSTmaybe;
	}

	/* If a timezone was specified, use that for generating the default
	 * time components instead of the local timezone. */
	if (gds->HaveZone && gmt_ptr != NULL) {
		now -= gds->Timezone;
		gmt_ptr = gmtime (&now);
		if (gmt_ptr != NULL)
			local = *gmt_ptr;
		now += gds->Timezone;
	}

	if (!gds->HaveYear)
		gds->Year = local.tm_year + 1900;
	if (!gds->HaveMonth)
		gds->Month = local.tm_mon + 1;
	if (!gds->HaveDay)
		gds->Day = local.tm_mday;
	/* Note: No default for hour/min/sec; a specifier that just
	 * gives date always refers to 00:00 on that date. */

	/* If we saw more than one time, timezone, weekday, year, month,
	 * or day, then give up. */
	if (gds->HaveTime > 1 || gds->HaveZone > 1 || gds->HaveWeekDay > 1
	    || gds->HaveYear > 1 || gds->HaveMonth > 1 || gds->HaveDay > 1)
		return -1;

	/* Compute an absolute time based on whatever absolute information
	 * we collected. */
	if (gds->HaveYear || gds->HaveMonth || gds->HaveDay
	    || gds->HaveTime || gds->HaveWeekDay) {
		Start = Convert(gds->Month, gds->Day, gds->Year,
		    gds->Hour, gds->Minutes, gds->Seconds,
		    gds->Timezone, gds->DSTmode);
		if (Start < 0)
			return -1;
	} else {
		Start = now;
		if (!gds->HaveRel)
			Start -= local.tm_hour * HOUR + local.tm_min * MINUTE
			    + local.tm_sec;
	}

	/* Add the relative offset. */
	Start += gds->RelSeconds;
	Start += RelativeMonth(Start, gds->Timezone, gds->RelMonth);

	/* Adjust for day-of-week offsets. */
	if (gds->HaveWeekDay
	    && !(gds->HaveYear || gds->HaveMonth || gds->HaveDay)) {
		tod = RelativeDate(Start, gds->Timezone,
		    gds->DSTmode, gds->DayOrdinal, gds->DayNumber);
		Start += tod;
	}

	/* -1 is an error indicator, so return 0 instead of -1 if
	 * that's the actual time. */
	return Start == -1 ? 0 : Start;
}